

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_schnorrsig.cpp
# Opt level: O0

SchnorrPubkey *
cfd::core::SchnorrPubkey::CreateTweakAddFromPrivkey
          (SchnorrPubkey *__return_storage_ptr__,Privkey *privkey,ByteData256 *tweak,
          Privkey *tweaked_privkey,bool *parity)

{
  int iVar1;
  undefined8 uVar2;
  uchar *puVar3;
  CfdException *pCVar4;
  ByteData256 local_1d0;
  ByteData local_1b8;
  Privkey local_1a0;
  int local_180;
  undefined1 local_17a [2];
  int pk_parity;
  secp256k1_xonly_pubkey x_only_pubkey;
  allocator local_111;
  string local_110;
  ByteData local_f0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d8;
  int local_c0;
  uint8_t local_bc [4];
  int ret;
  secp256k1_keypair keypair;
  secp256k1_context_struct *ctx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_bytes;
  bool *parity_local;
  Privkey *tweaked_privkey_local;
  ByteData256 *tweak_local;
  Privkey *privkey_local;
  
  tweak_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = parity;
  ByteData256::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ctx,tweak);
  uVar2 = wally_get_secp_context();
  Privkey::GetData(&local_f0,privkey);
  ByteData::GetBytes(&local_d8,&local_f0);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8);
  iVar1 = secp256k1_keypair_create(uVar2,local_bc,puVar3);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8);
  ByteData::~ByteData(&local_f0);
  local_c0 = iVar1;
  if (iVar1 != 1) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_110,"Invalid private key",&local_111);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_110);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ctx);
  local_c0 = secp256k1_keypair_xonly_tweak_add(uVar2,local_bc,puVar3);
  if (local_c0 != 1) {
    x_only_pubkey.data[0x38] = '\x01';
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(x_only_pubkey.data + 0x3a),"Could not tweak add key pair",
               (allocator *)(x_only_pubkey.data + 0x39));
    CfdException::CfdException(pCVar4,kCfdInternalError,(string *)(x_only_pubkey.data + 0x3a));
    x_only_pubkey.data[0x38] = '\0';
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_180 = 0;
  local_c0 = secp256k1_keypair_xonly_pub(uVar2,local_17a,&local_180,local_bc);
  if (local_c0 != 1) {
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    CfdException::CfdException(pCVar4,kCfdInternalError);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (tweaked_privkey != (Privkey *)0x0) {
    ByteData::ByteData(&local_1b8,local_bc,0x20);
    Privkey::Privkey(&local_1a0,&local_1b8,kMainnet,true);
    Privkey::operator=(tweaked_privkey,&local_1a0);
    Privkey::~Privkey(&local_1a0);
    ByteData::~ByteData(&local_1b8);
  }
  if (tweak_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    *tweak_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
     super__Vector_impl_data._M_end_of_storage = local_180 != 0;
  }
  ConvertSchnorrPubkey(&local_1d0,(secp256k1_xonly_pubkey *)local_17a);
  SchnorrPubkey(__return_storage_ptr__,&local_1d0);
  ByteData256::~ByteData256(&local_1d0);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ctx);
  return __return_storage_ptr__;
}

Assistant:

SchnorrPubkey SchnorrPubkey::CreateTweakAddFromPrivkey(
    const Privkey &privkey, const ByteData256 &tweak, Privkey *tweaked_privkey,
    bool *parity) {
  std::vector<uint8_t> tweak_bytes = tweak.GetBytes();
  auto ctx = wally_get_secp_context();

  secp256k1_keypair keypair;
  auto ret = secp256k1_keypair_create(
      ctx, &keypair, privkey.GetData().GetBytes().data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid private key");
  }

  ret = secp256k1_keypair_xonly_tweak_add(ctx, &keypair, tweak_bytes.data());
  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not tweak add key pair");
  }

  secp256k1_xonly_pubkey x_only_pubkey;
  int pk_parity = 0;
  ret = secp256k1_keypair_xonly_pub(ctx, &x_only_pubkey, &pk_parity, &keypair);
  if (ret != 1) {
    throw CfdException(CfdError::kCfdInternalError);
  }

  if (tweaked_privkey != nullptr) {
    *tweaked_privkey = Privkey(ByteData(keypair.data, Privkey::kPrivkeySize));
  }
  if (parity != nullptr) *parity = (pk_parity != 0);
  return SchnorrPubkey(ConvertSchnorrPubkey(x_only_pubkey));
}